

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O2

void __thiscall
Assimp::ComputeUVMappingProcess::ComputeSphereMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  aiVector3t<float> *paVar1;
  uint pnt;
  ulong uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  aiVector3t<float> aVar10;
  aiMatrix4x4 mTrafo;
  aiVector3D local_b0;
  aiVector3t<float> local_a0;
  aiMatrix4x4t<float> local_90;
  aiVector3D local_50;
  aiVector3D local_40;
  
  local_b0.x = 0.0;
  local_b0.y = 0.0;
  local_b0.z = 0.0;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 0.0;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.z = 0.0;
  FindMeshCenter(mesh,&local_b0,&local_40,&local_50);
  fVar4 = ::operator*(axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_x);
  if (0.95 <= fVar4) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < mesh->mNumVertices; uVar2 = uVar2 + 1) {
      aVar10 = operator-((aiVector3t<float> *)((long)&mesh->mVertices->x + lVar3),&local_b0);
      local_90.a3 = aVar10.z;
      local_90.a1 = aVar10.x;
      local_90.a2 = aVar10.y;
      paVar1 = aiVector3t<float>::Normalize((aiVector3t<float> *)&local_90);
      fVar4 = paVar1->x;
      fVar5 = atan2f(paVar1->z,paVar1->y);
      fVar4 = asinf(fVar4);
      auVar7._0_4_ = fVar5 + 3.1415927;
      auVar7._4_4_ = fVar4 + 1.5707964;
      auVar7._8_4_ = extraout_XMM0_Db_01 + 0.0;
      auVar7._12_4_ = extraout_XMM0_Db_02 + 0.0;
      auVar7 = divps(auVar7,_DAT_0059f2f0);
      *(long *)((long)&out->x + lVar3) = auVar7._0_8_;
      *(undefined4 *)((long)&out->z + lVar3) = 0;
      lVar3 = lVar3 + 0xc;
    }
  }
  else {
    fVar4 = ::operator*(axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y);
    if (0.95 <= fVar4) {
      lVar3 = 0;
      for (uVar2 = 0; uVar2 < mesh->mNumVertices; uVar2 = uVar2 + 1) {
        aVar10 = operator-((aiVector3t<float> *)((long)&mesh->mVertices->x + lVar3),&local_b0);
        local_90.a3 = aVar10.z;
        local_90.a1 = aVar10.x;
        local_90.a2 = aVar10.y;
        paVar1 = aiVector3t<float>::Normalize((aiVector3t<float> *)&local_90);
        fVar4 = paVar1->y;
        fVar5 = atan2f(paVar1->x,paVar1->z);
        fVar4 = asinf(fVar4);
        auVar8._0_4_ = fVar5 + 3.1415927;
        auVar8._4_4_ = fVar4 + 1.5707964;
        auVar8._8_4_ = extraout_XMM0_Db_03 + 0.0;
        auVar8._12_4_ = extraout_XMM0_Db_04 + 0.0;
        auVar7 = divps(auVar8,_DAT_0059f2f0);
        *(long *)((long)&out->x + lVar3) = auVar7._0_8_;
        *(undefined4 *)((long)&out->z + lVar3) = 0;
        lVar3 = lVar3 + 0xc;
      }
    }
    else {
      fVar4 = ::operator*(axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_z);
      if (0.95 <= fVar4) {
        lVar3 = 0;
        for (uVar2 = 0; uVar2 < mesh->mNumVertices; uVar2 = uVar2 + 1) {
          aVar10 = operator-((aiVector3t<float> *)((long)&mesh->mVertices->x + lVar3),&local_b0);
          local_90.a3 = aVar10.z;
          local_90.a1 = aVar10.x;
          local_90.a2 = aVar10.y;
          paVar1 = aiVector3t<float>::Normalize((aiVector3t<float> *)&local_90);
          fVar4 = paVar1->z;
          fVar5 = atan2f(paVar1->y,paVar1->x);
          fVar4 = asinf(fVar4);
          auVar9._0_4_ = fVar5 + 3.1415927;
          auVar9._4_4_ = fVar4 + 1.5707964;
          auVar9._8_4_ = extraout_XMM0_Db_05 + 0.0;
          auVar9._12_4_ = extraout_XMM0_Db_06 + 0.0;
          auVar7 = divps(auVar9,_DAT_0059f2f0);
          *(long *)((long)&out->x + lVar3) = auVar7._0_8_;
          *(undefined4 *)((long)&out->z + lVar3) = 0;
          lVar3 = lVar3 + 0xc;
        }
      }
      else {
        local_90.a1 = 1.0;
        local_90.a2 = 0.0;
        local_90.a3 = 0.0;
        local_90.a4 = 0.0;
        local_90.b1 = 0.0;
        local_90.b2 = 1.0;
        local_90.b3 = 0.0;
        local_90.b4 = 0.0;
        local_90.c1 = 0.0;
        local_90.c2 = 0.0;
        local_90.c3 = 1.0;
        local_90.c4 = 0.0;
        local_90.d1 = 0.0;
        local_90.d2 = 0.0;
        local_90.d3 = 0.0;
        local_90.d4 = 1.0;
        aiMatrix4x4t<float>::FromToMatrix
                  (axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y,&local_90);
        lVar3 = 0;
        for (uVar2 = 0; uVar2 < mesh->mNumVertices; uVar2 = uVar2 + 1) {
          aVar10 = ::operator*(&local_90,(aiVector3t<float> *)((long)&mesh->mVertices->x + lVar3));
          local_a0.z = aVar10.z - local_b0.z;
          local_a0.y = aVar10.y - local_b0.y;
          local_a0.x = aVar10.x - local_b0.x;
          paVar1 = aiVector3t<float>::Normalize(&local_a0);
          fVar4 = paVar1->z;
          fVar5 = atan2f(paVar1->y,paVar1->x);
          fVar4 = asinf(fVar4);
          auVar6._0_4_ = fVar5 + 3.1415927;
          auVar6._4_4_ = fVar4 + 1.5707964;
          auVar6._8_4_ = extraout_XMM0_Db + 0.0;
          auVar6._12_4_ = extraout_XMM0_Db_00 + 0.0;
          auVar7 = divps(auVar6,_DAT_0059f2f0);
          *(long *)((long)&out->x + lVar3) = auVar7._0_8_;
          *(undefined4 *)((long)&out->z + lVar3) = 0;
          lVar3 = lVar3 + 0xc;
        }
      }
    }
  }
  RemoveUVSeams(mesh,out);
  return;
}

Assistant:

void ComputeUVMappingProcess::ComputeSphereMapping(aiMesh* mesh,const aiVector3D& axis, aiVector3D* out)
{
    aiVector3D center, min, max;
    FindMeshCenter(mesh, center, min, max);

    // If the axis is one of x,y,z run a faster code path. It's worth the extra effort ...
    // currently the mapping axis will always be one of x,y,z, except if the
    // PretransformVertices step is used (it transforms the meshes into worldspace,
    // thus changing the mapping axis)
    if (axis * base_axis_x >= angle_epsilon)    {

        // For each point get a normalized projection vector in the sphere,
        // get its longitude and latitude and map them to their respective
        // UV axes. Problems occur around the poles ... unsolvable.
        //
        // The spherical coordinate system looks like this:
        // x = cos(lon)*cos(lat)
        // y = sin(lon)*cos(lat)
        // z = sin(lat)
        //
        // Thus we can derive:
        // lat  = arcsin (z)
        // lon  = arctan (y/x)
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.z, diff.y) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.x) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    else if (axis * base_axis_y >= angle_epsilon)   {
        // ... just the same again
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.x, diff.z) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.y) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    else if (axis * base_axis_z >= angle_epsilon)   {
        // ... just the same again
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.y, diff.x) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.z) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    // slower code path in case the mapping axis is not one of the coordinate system axes
    else    {
        aiMatrix4x4 mTrafo;
        aiMatrix4x4::FromToMatrix(axis,base_axis_y,mTrafo);

        // again the same, except we're applying a transformation now
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = ((mTrafo*mesh->mVertices[pnt])-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.y, diff.x) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin(diff.z) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }


    // Now find and remove UV seams. A seam occurs if a face has a tcoord
    // close to zero on the one side, and a tcoord close to one on the
    // other side.
    RemoveUVSeams(mesh,out);
}